

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_listen(uv_pipe_t *handle,int backlog,uv_connection_cb cb)

{
  int iVar1;
  int *piVar2;
  uv_loop_t *in_RDX;
  int in_ESI;
  long in_RDI;
  uv__io_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*(int *)(in_RDI + 0xa0) == -1) {
    local_4 = -0x16;
  }
  else {
    iVar1 = listen(*(int *)(in_RDI + 0xa0),in_ESI);
    if (iVar1 == 0) {
      *(uv_loop_t **)(in_RDI + 200) = in_RDX;
      *(code **)(in_RDI + 0x70) = uv__server_io;
      uv__io_start(in_RDX,in_stack_ffffffffffffffd8,0);
      local_4 = 0;
    }
    else {
      piVar2 = __errno_location();
      local_4 = -*piVar2;
    }
  }
  return local_4;
}

Assistant:

int uv_pipe_listen(uv_pipe_t* handle, int backlog, uv_connection_cb cb) {
  if (uv__stream_fd(handle) == -1)
    return -EINVAL;

  if (listen(uv__stream_fd(handle), backlog))
    return -errno;

  handle->connection_cb = cb;
  handle->io_watcher.cb = uv__server_io;
  uv__io_start(handle->loop, &handle->io_watcher, UV__POLLIN);
  return 0;
}